

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContinuumMaterial.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChContinuumElastic::ArchiveIN(ChContinuumElastic *this,ChArchiveIn *marchive)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveIn::VersionRead<chrono::fea::ChContinuumElastic>(marchive);
  ChArchiveIn::VersionRead<chrono::fea::ChContinuumMaterial>(marchive);
  local_30 = &(this->super_ChContinuumMaterial).density;
  local_38 = "density";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->E;
  local_38 = "this->E";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->v;
  local_38 = "this->v";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  dVar1 = this->v;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = dVar1;
  auVar2._0_8_ = this->E;
  auVar2._8_8_ = this->v;
  auVar6._8_8_ = 0x4000000000000000;
  auVar6._0_8_ = 0x4000000000000000;
  auVar3 = vfmadd231sd_fma(ZEXT816(0x3ff0000000000000),auVar3,ZEXT816(0xc000000000000000));
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dVar1 * (double)auVar2._0_8_;
  auVar2 = vunpcklpd_avx(auVar2,auVar5);
  auVar3 = vunpcklpd_avx(auVar6,auVar3);
  auVar4._0_8_ = (dVar1 + 1.0) * auVar3._0_8_;
  auVar4._8_8_ = (dVar1 + 1.0) * auVar3._8_8_;
  auVar2 = vdivpd_avx(auVar2,auVar4);
  this->G = (double)auVar2._0_8_;
  this->l = (double)auVar2._8_8_;
  ComputeStressStrainMatrix(this);
  local_30 = &this->damping_M;
  local_38 = "this->damping_M";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->damping_K;
  local_38 = "this->damping_K";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  return;
}

Assistant:

void ChContinuumElastic::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChContinuumElastic>();
    // deserialize parent class
    ChContinuumMaterial::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(this->E);
    marchive >> CHNVP(this->v);
    this->Set_v(this->v);  // G and l from v
    marchive >> CHNVP(this->damping_M);
    marchive >> CHNVP(this->damping_K);
}